

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_options<char>::basic_json_options(basic_json_options<char> *this)

{
  basic_json_options_common<char>::basic_json_options_common
            ((basic_json_options_common<char> *)
             &(this->super_basic_json_decode_options<char>).field_0x70);
  (this->super_basic_json_decode_options<char>)._vptr_basic_json_decode_options =
       (_func_int **)&PTR__basic_json_decode_options_00b2fb30;
  *(undefined ***)&(this->super_basic_json_decode_options<char>).field_0x70 =
       &PTR__basic_json_decode_options_00b2fb58;
  (this->super_basic_json_decode_options<char>).lossless_number_ = false;
  (this->super_basic_json_decode_options<char>).allow_comments_ = true;
  (this->super_basic_json_decode_options<char>).allow_trailing_comma_ = false;
  *(undefined8 *)
   &(this->super_basic_json_decode_options<char>).err_handler_.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_json_decode_options<char>).err_handler_.super__Function_base.
           _M_functor + 8) = 0;
  (this->super_basic_json_decode_options<char>).err_handler_._M_invoker =
       std::
       _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
       ::_M_invoke;
  (this->super_basic_json_decode_options<char>).err_handler_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
       ::_M_manager;
  basic_json_encode_options<char>::basic_json_encode_options
            ((basic_json_encode_options<char> *)
             &(this->super_basic_json_decode_options<char>).field_0x30,
             &PTR_construction_vtable_24__00b2faf8);
  (this->super_basic_json_decode_options<char>)._vptr_basic_json_decode_options =
       (_func_int **)0xb2fa80;
  *(undefined8 *)&(this->super_basic_json_decode_options<char>).field_0x70 = 0xb2fad0;
  *(undefined8 *)&(this->super_basic_json_decode_options<char>).field_0x30 = 0xb2faa8;
  return;
}

Assistant:

basic_json_options() = default;